

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O0

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar1;
  float bias_2;
  float scale_2;
  float *ptr_2;
  int *intptr_2;
  int q;
  float bias_1;
  float scale_1;
  float *ptr_1;
  int *intptr_1;
  int i;
  float bias;
  float scale;
  float *ptr;
  int *intptr;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m;
  Mat *m_1;
  float local_424;
  float local_420;
  float local_41c;
  Allocator *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  float local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined4 local_380;
  long local_378;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined8 local_358;
  float *local_350;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined4 local_320;
  long local_318;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined8 local_2f8;
  int *local_2f0;
  int local_2e4;
  float local_2e0;
  float local_2dc;
  float *local_2d8;
  int *local_2d0;
  int local_2c4;
  float local_2c0;
  float local_2bc;
  float *local_2b8;
  int *local_2b0;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  long *local_290;
  long *local_288;
  int local_274;
  undefined8 *local_270;
  undefined8 *local_260;
  long *local_250;
  undefined8 *local_248;
  long *local_240;
  undefined8 *local_238;
  long *local_230;
  long local_228;
  long *local_220;
  undefined8 local_218;
  undefined8 *local_210;
  long local_208;
  long *local_200;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  long local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  long local_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 *local_190;
  int local_184;
  long *local_180;
  int local_174;
  long *local_170;
  undefined1 local_165;
  int local_164;
  undefined8 *local_158;
  undefined1 local_145;
  int local_144;
  undefined8 *local_138;
  undefined8 *local_f0;
  undefined8 *local_d0;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  float *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  int *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_29c = (int)in_RSI[5];
  local_2a0 = *(int *)((long)in_RSI + 0x2c);
  local_2a4 = (int)in_RSI[6];
  local_2a8 = (int)in_RSI[7];
  local_290 = in_RDX;
  local_288 = in_RSI;
  Mat::create_like(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  local_250 = local_290;
  bVar1 = true;
  if (*local_290 != 0) {
    local_98 = local_290;
    bVar1 = local_290[8] * (long)(int)local_290[7] == 0;
  }
  if (bVar1) {
    local_274 = -100;
  }
  else {
    if (local_29c == 1) {
      local_240 = local_288;
      local_2b0 = (int *)*local_288;
      local_230 = local_290;
      local_2b8 = (float *)*local_290;
      local_190 = (undefined8 *)(in_RDI + 0xd8);
      local_198 = 0;
      local_2bc = *(float *)*local_190;
      if (*(int *)(in_RDI + 0xd4) == 0) {
        local_3bc = 0.0;
      }
      else {
        local_1a0 = (undefined8 *)(in_RDI + 0x120);
        local_1a8 = 0;
        local_3bc = *(float *)*local_1a0;
      }
      local_2c0 = local_3bc;
      dequantize(local_2b0,local_2b8,local_2bc,local_3bc,local_2a0);
    }
    if (local_29c == 2) {
      for (local_2c4 = 0; local_2c4 < local_2a4; local_2c4 = local_2c4 + 1) {
        local_180 = local_288;
        local_184 = local_2c4;
        local_2d0 = (int *)(*local_288 +
                           (long)*(int *)((long)local_288 + 0x2c) * (long)local_2c4 * local_288[2]);
        local_170 = local_290;
        local_174 = local_2c4;
        local_2d8 = (float *)(*local_290 +
                             (long)*(int *)((long)local_290 + 0x2c) * (long)local_2c4 * local_290[2]
                             );
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_1b0 = (undefined8 *)(in_RDI + 0xd8);
          local_1b8 = 0;
          local_3c0 = *(float *)*local_1b0;
        }
        else {
          local_1c0 = (long *)(in_RDI + 0xd8);
          local_1c8 = (long)local_2c4;
          local_3c0 = *(float *)(*local_1c0 + local_1c8 * 4);
        }
        local_2dc = local_3c0;
        if (*(int *)(in_RDI + 0xd4) == 0) {
          local_3c4 = 0.0;
        }
        else {
          if (*(int *)(in_RDI + 0xd4) == 1) {
            local_1d0 = (undefined8 *)(in_RDI + 0x120);
            local_1d8 = 0;
            local_3c8 = *(float *)*local_1d0;
          }
          else {
            local_1e0 = (long *)(in_RDI + 0x120);
            local_1e8 = (long)local_2c4;
            local_3c8 = *(float *)(*local_1e0 + local_1e8 * 4);
          }
          local_3c4 = local_3c8;
        }
        local_2e0 = local_3c4;
        dequantize(local_2d0,local_2d8,local_3c0,local_3c4,local_2a0);
      }
    }
    if (local_29c == 3) {
      for (local_2e4 = 0; local_2e4 < local_2a8; local_2e4 = local_2e4 + 1) {
        local_158 = &local_338;
        local_2c = *(int *)((long)local_288 + 0x2c);
        local_30 = (int)local_288[6];
        local_34 = *(undefined4 *)((long)local_288 + 0x34);
        local_2f0 = (int *)(*local_288 + local_288[8] * (long)local_2e4 * local_288[2]);
        local_48 = local_288[2];
        local_4c = (undefined4)local_288[3];
        local_58 = local_288[4];
        local_28 = &local_338;
        local_18 = (long)local_2c * (long)local_30 * local_48;
        local_248 = &local_338;
        local_270 = &local_338;
        local_138 = &local_398;
        local_64 = *(int *)((long)local_290 + 0x2c);
        local_68 = (int)local_290[6];
        local_6c = *(undefined4 *)((long)local_290 + 0x34);
        local_350 = (float *)(*local_290 + local_290[8] * (long)local_2e4 * local_290[2]);
        local_80 = local_290[2];
        local_84 = (undefined4)local_290[3];
        local_90 = local_290[4];
        local_60 = &local_398;
        local_8 = (long)local_64 * (long)local_68 * local_80;
        local_238 = &local_398;
        local_260 = &local_398;
        local_300 = 0;
        local_304 = 0;
        local_308 = 0;
        local_30c = 0;
        local_320 = 0;
        local_328 = 0;
        local_330 = 0;
        local_338 = 0;
        local_c = 0x10;
        local_1c = 0x10;
        local_144 = local_2e4;
        local_145 = 1;
        local_164 = local_2e4;
        local_165 = 1;
        local_2f8 = 0;
        local_310 = 0;
        local_398 = 0;
        local_388 = 0;
        local_380 = 0;
        local_370 = 0;
        local_36c = 0;
        local_368 = 0;
        local_364 = 0;
        local_360 = 0;
        local_358 = 0;
        local_390 = 0;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_1f0 = (undefined8 *)(in_RDI + 0xd8);
          local_1f8 = 0;
          local_41c = *(float *)*local_1f0;
        }
        else {
          local_200 = (long *)(in_RDI + 0xd8);
          local_208 = (long)local_2e4;
          local_41c = *(float *)(*local_200 + local_208 * 4);
        }
        if (*(int *)(in_RDI + 0xd4) == 0) {
          local_420 = 0.0;
        }
        else {
          if (*(int *)(in_RDI + 0xd4) == 1) {
            local_210 = (undefined8 *)(in_RDI + 0x120);
            local_218 = 0;
            local_424 = *(float *)*local_210;
          }
          else {
            local_220 = (long *)(in_RDI + 0x120);
            local_228 = (long)local_2e4;
            local_424 = *(float *)(*local_220 + local_228 * 4);
          }
          local_420 = local_424;
        }
        local_f0 = local_260;
        local_d0 = local_270;
        local_78 = local_350;
        local_40 = local_2f0;
        local_378 = local_90;
        local_318 = local_58;
        dequantize(local_2f0,local_350,local_41c,local_420,local_2a0 * local_2a4);
      }
    }
    local_274 = 0;
  }
  return local_274;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        // assert scale_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        const float scale = scale_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];

        dequantize(intptr, ptr, scale, bias, w);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];

            dequantize(intptr, ptr, scale, bias, w);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];

            dequantize(intptr, ptr, scale, bias, w * h);
        }
    }

    return 0;
}